

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  slot_type *psVar5;
  slot_type *psVar6;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10) || psVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 == (slot_type *)(kEmptyGroup + 0x10) || psVar2 == (slot_type *)0x0) ||
       (kSentinel < *(ctrl_t *)psVar2)) {
      if (psVar1 == (slot_type *)(kEmptyGroup + 0x10) && psVar2 == (slot_type *)(kEmptyGroup + 0x10)
         ) {
LAB_00c12169:
        return psVar1 == psVar2;
      }
      if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10)) !=
          (psVar2 == (slot_type *)(kEmptyGroup + 0x10))) goto LAB_00c12185;
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_00c12169;
      if ((psVar2 == (slot_type *)kSooControl) == (psVar1 == (slot_type *)kSooControl)) {
        psVar3 = (a->field_1).slot_;
        psVar4 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)kSooControl) {
          if (psVar3 == psVar4) goto LAB_00c12169;
        }
        else {
          psVar6 = psVar4;
          psVar5 = psVar2;
          if (psVar2 < psVar1) {
            psVar6 = psVar3;
            psVar5 = psVar1;
            psVar3 = psVar4;
          }
          if ((psVar5 < psVar3) && (psVar3 <= psVar6)) goto LAB_00c12169;
        }
      }
      operator==();
      goto LAB_00c1217b;
    }
  }
  else {
LAB_00c1217b:
    operator==();
  }
  operator==();
LAB_00c12185:
  operator==();
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }